

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O2

void duckdb::STDDevBaseOperation::Execute<double,duckdb::StddevState>
               (StddevState *state,double *input)

{
  double dVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  uVar2 = state->count + 1;
  state->count = uVar2;
  dVar1 = *input;
  dVar3 = dVar1 - state->mean;
  auVar5._8_4_ = (int)(uVar2 >> 0x20);
  auVar5._0_8_ = uVar2;
  auVar5._12_4_ = 0x45300000;
  dVar4 = dVar3 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) + state->mean;
  state->mean = dVar4;
  state->dsquared = (dVar1 - dVar4) * dVar3 + state->dsquared;
  return;
}

Assistant:

static void Execute(STATE &state, const INPUT_TYPE &input) {
		// update running mean and d^2
		state.count++;
		const double mean_differential = (input - state.mean) / state.count;
		const double new_mean = state.mean + mean_differential;
		const double dsquared_increment = (input - new_mean) * (input - state.mean);
		const double new_dsquared = state.dsquared + dsquared_increment;

		state.mean = new_mean;
		state.dsquared = new_dsquared;
	}